

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_iface_common.h
# Opt level: O0

aom_codec_err_t image2yuvconfig(aom_image_t *img,YV12_BUFFER_CONFIG *yv12)

{
  int local_18;
  int border;
  YV12_BUFFER_CONFIG *yv12_local;
  aom_image_t *img_local;
  
  (yv12->field_5).field_0.y_buffer = img->planes[0];
  (yv12->field_5).field_0.u_buffer = img->planes[1];
  (yv12->field_5).field_0.v_buffer = img->planes[2];
  (yv12->field_2).field_0.y_crop_width = img->d_w;
  (yv12->field_3).field_0.y_crop_height = img->d_h;
  yv12->render_width = img->r_w;
  yv12->render_height = img->r_h;
  (yv12->field_0).field_0.y_width = img->w;
  (yv12->field_1).field_0.y_height = img->h;
  (yv12->field_0).field_0.uv_width =
       (yv12->field_0).field_0.y_width + img->x_chroma_shift >> ((byte)img->x_chroma_shift & 0x1f);
  (yv12->field_1).field_0.uv_height =
       (yv12->field_1).field_0.y_height + img->y_chroma_shift >> ((byte)img->y_chroma_shift & 0x1f);
  (yv12->field_2).field_0.uv_crop_width =
       (yv12->field_2).field_0.y_crop_width + img->x_chroma_shift >>
       ((byte)img->x_chroma_shift & 0x1f);
  (yv12->field_3).field_0.uv_crop_height =
       (yv12->field_3).field_0.y_crop_height + img->y_chroma_shift >>
       ((byte)img->y_chroma_shift & 0x1f);
  (yv12->field_4).field_0.y_stride = img->stride[0];
  (yv12->field_4).field_0.uv_stride = img->stride[1];
  yv12->color_primaries = img->cp;
  yv12->transfer_characteristics = img->tc;
  yv12->matrix_coefficients = img->mc;
  yv12->monochrome = (uint8_t)img->monochrome;
  yv12->chroma_sample_position = img->csp;
  yv12->color_range = img->range;
  if ((img->fmt & 0x800) == AOM_IMG_FMT_NONE) {
    yv12->flags = 0;
  }
  else {
    (yv12->field_5).field_0.y_buffer = (uint8_t *)((ulong)(yv12->field_5).field_0.y_buffer >> 1);
    (yv12->field_5).field_0.u_buffer = (uint8_t *)((ulong)(yv12->field_5).field_0.u_buffer >> 1);
    (yv12->field_5).field_0.v_buffer = (uint8_t *)((ulong)(yv12->field_5).field_0.v_buffer >> 1);
    (yv12->field_4).field_0.y_stride = (yv12->field_4).field_0.y_stride >> 1;
    (yv12->field_4).field_0.uv_stride = (yv12->field_4).field_0.uv_stride >> 1;
    yv12->flags = 8;
  }
  local_18 = (int)((yv12->field_4).field_0.y_stride - (img->w + 0x1f & 0xffffffe0)) / 2;
  if (local_18 < 0) {
    local_18 = 0;
  }
  yv12->border = local_18;
  yv12->subsampling_x = img->x_chroma_shift;
  yv12->subsampling_y = img->y_chroma_shift;
  yv12->metadata = img->metadata;
  return AOM_CODEC_OK;
}

Assistant:

static inline aom_codec_err_t image2yuvconfig(const aom_image_t *img,
                                              YV12_BUFFER_CONFIG *yv12) {
  yv12->y_buffer = img->planes[AOM_PLANE_Y];
  yv12->u_buffer = img->planes[AOM_PLANE_U];
  yv12->v_buffer = img->planes[AOM_PLANE_V];

  yv12->y_crop_width = img->d_w;
  yv12->y_crop_height = img->d_h;
  yv12->render_width = img->r_w;
  yv12->render_height = img->r_h;
  yv12->y_width = img->w;
  yv12->y_height = img->h;

  yv12->uv_width = (yv12->y_width + img->x_chroma_shift) >> img->x_chroma_shift;
  yv12->uv_height =
      (yv12->y_height + img->y_chroma_shift) >> img->y_chroma_shift;
  yv12->uv_crop_width =
      (yv12->y_crop_width + img->x_chroma_shift) >> img->x_chroma_shift;
  yv12->uv_crop_height =
      (yv12->y_crop_height + img->y_chroma_shift) >> img->y_chroma_shift;

  yv12->y_stride = img->stride[AOM_PLANE_Y];
  yv12->uv_stride = img->stride[AOM_PLANE_U];
  yv12->color_primaries = img->cp;
  yv12->transfer_characteristics = img->tc;
  yv12->matrix_coefficients = img->mc;
  yv12->monochrome = img->monochrome;
  yv12->chroma_sample_position = img->csp;
  yv12->color_range = img->range;

  if (img->fmt & AOM_IMG_FMT_HIGHBITDEPTH) {
    // In aom_image_t
    //     planes point to uint8 address of start of data
    //     stride counts uint8s to reach next row
    // In YV12_BUFFER_CONFIG
    //     y_buffer, u_buffer, v_buffer point to uint16 address of data
    //     stride and border counts in uint16s
    // This means that all the address calculations in the main body of code
    // should work correctly.
    // However, before we do any pixel operations we need to cast the address
    // to a uint16 ponter and double its value.
    yv12->y_buffer = CONVERT_TO_BYTEPTR(yv12->y_buffer);
    yv12->u_buffer = CONVERT_TO_BYTEPTR(yv12->u_buffer);
    yv12->v_buffer = CONVERT_TO_BYTEPTR(yv12->v_buffer);
    yv12->y_stride >>= 1;
    yv12->uv_stride >>= 1;
    yv12->flags = YV12_FLAG_HIGHBITDEPTH;
  } else {
    yv12->flags = 0;
  }

  // Note(yunqing): if img is allocated the same as the frame buffer, y_stride
  // is 32-byte aligned. Also, handle the cases while allocating img without a
  // border or stride_align is less than 32.
  int border = (yv12->y_stride - (int)((img->w + 31) & ~31u)) / 2;
  yv12->border = (border < 0) ? 0 : border;
  yv12->subsampling_x = img->x_chroma_shift;
  yv12->subsampling_y = img->y_chroma_shift;
  yv12->metadata = img->metadata;
  return AOM_CODEC_OK;
}